

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O0

Color __thiscall TRM::Color::blend(Color *this,Color *src)

{
  value_type vVar1;
  byte bVar2;
  value_type vVar3;
  byte bVar4;
  value_type vVar5;
  byte bVar6;
  value_type vVar7;
  byte *pbVar8;
  const_reference pvVar9;
  float fVar10;
  uint8_t a;
  uint8_t b;
  uint8_t g;
  uint8_t r;
  float one_minus_alpha;
  float alpha;
  Color *src_local;
  Color *this_local;
  
  pbVar8 = std::array<unsigned_char,_4UL>::operator[](&src->fRGBA,3);
  fVar10 = 1.0 - (float)*pbVar8 / 255.0;
  pvVar9 = std::array<unsigned_char,_4UL>::operator[](&src->fRGBA,0);
  vVar1 = *pvVar9;
  pbVar8 = std::array<unsigned_char,_4UL>::operator[](&this->fRGBA,0);
  bVar2 = *pbVar8;
  pvVar9 = std::array<unsigned_char,_4UL>::operator[](&src->fRGBA,1);
  vVar3 = *pvVar9;
  pbVar8 = std::array<unsigned_char,_4UL>::operator[](&this->fRGBA,1);
  bVar4 = *pbVar8;
  pvVar9 = std::array<unsigned_char,_4UL>::operator[](&src->fRGBA,2);
  vVar5 = *pvVar9;
  pbVar8 = std::array<unsigned_char,_4UL>::operator[](&this->fRGBA,1);
  bVar6 = *pbVar8;
  pvVar9 = std::array<unsigned_char,_4UL>::operator[](&src->fRGBA,3);
  vVar7 = *pvVar9;
  pbVar8 = std::array<unsigned_char,_4UL>::operator[](&this->fRGBA,3);
  Color((Color *)((long)&this_local + 4),vVar1 + (char)(int)((float)bVar2 * fVar10),
        vVar3 + (char)(int)((float)bVar4 * fVar10),vVar5 + (char)(int)((float)bVar6 * fVar10),
        vVar7 + (char)(int)((float)*pbVar8 * fVar10));
  return (array<unsigned_char,_4UL>)(array<unsigned_char,_4UL>)this_local._4_4_;
}

Assistant:

Color Color::blend(const Color& src) const {
  float alpha = float(src.fRGBA[color_A]) / 255.f;
  float one_minus_alpha = 1.f - alpha;

  uint8_t r =
      src.fRGBA[color_R] + uint8_t(this->fRGBA[color_R] * one_minus_alpha);
  uint8_t g =
      src.fRGBA[color_G] + uint8_t(this->fRGBA[color_G] * one_minus_alpha);
  uint8_t b =
      src.fRGBA[color_B] + uint8_t(this->fRGBA[color_G] * one_minus_alpha);
  uint8_t a =
      src.fRGBA[color_A] + uint8_t(this->fRGBA[color_A] * one_minus_alpha);

  return Color(r, g, b, a);
}